

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void lodepng_encoder_settings_init(LodePNGEncoderSettings *settings)

{
  LodePNGCompressSettings *in_RDI;
  
  lodepng_compress_settings_init(in_RDI);
  in_RDI[1].use_lz77 = 1;
  in_RDI[1].windowsize = 5;
  in_RDI[1].btype = 1;
  *(undefined4 *)&in_RDI[1].custom_zlib = 0;
  in_RDI[1].nicematch = 0;
  in_RDI[1].lazymatching = 0;
  *(undefined4 *)((long)&in_RDI[1].custom_zlib + 4) = 0;
  *(undefined4 *)&in_RDI[1].custom_deflate = 1;
  return;
}

Assistant:

void lodepng_encoder_settings_init(LodePNGEncoderSettings* settings) {
  lodepng_compress_settings_init(&settings->zlibsettings);
  settings->filter_palette_zero = 1;
  settings->filter_strategy = LFS_MINSUM;
  settings->auto_convert = 1;
  settings->force_palette = 0;
  settings->predefined_filters = 0;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  settings->add_id = 0;
  settings->text_compression = 1;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
}